

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O3

Float __thiscall pbrt::LanczosSincFilter::Integral(LanczosSincFilter *this)

{
  float fVar1;
  float fVar2;
  Tuple2<pbrt::Vector2,_float> TVar3;
  int iVar4;
  int x;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  Float FVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 in_register_00001444 [12];
  Tuple2<pbrt::Point2,_float> local_50;
  undefined1 local_48 [16];
  
  auVar18 = ZEXT1664(CONCAT412(0x3f7fffff,CONCAT48(0x3f7fffff,0x3f7fffff3f7fffff)));
  auVar20 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
  fVar1 = (this->radius).super_Tuple2<pbrt::Vector2,_float>.x;
  fVar2 = (this->radius).super_Tuple2<pbrt::Vector2,_float>.y;
  auVar9 = vpmovsxbq_avx(ZEXT216(0x2d1b));
  auVar17 = ZEXT1664(auVar9);
  auVar9 = vpmovsxbq_avx(ZEXT216(0x1b2d));
  auVar19 = ZEXT1664(auVar9);
  uVar6 = 0x853c49e6748fea9b;
  fVar11 = 0.0;
  iVar4 = 0;
  do {
    local_48._0_4_ = (undefined4)iVar4;
    local_48._4_12_ = in_register_00001444;
    iVar5 = 0;
    do {
      auVar9._0_4_ = (float)iVar5;
      auVar9._4_12_ = in_register_00001444;
      auVar9 = vinsertps_avx(auVar9,ZEXT416((uint)local_48._0_4_),0x10);
      uVar7 = uVar6 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = uVar6;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = uVar7;
      auVar13 = vpunpcklqdq_avx(auVar12,auVar15);
      auVar10 = vpsrlvq_avx2(auVar13,auVar17._0_16_);
      auVar12 = vpsrlvq_avx2(auVar13,auVar19._0_16_);
      auVar13 = vpsrlq_avx(auVar13,0x3b);
      auVar13 = vpshufd_avx(auVar13,0xe8);
      TVar3 = (this->radius).super_Tuple2<pbrt::Vector2,_float>;
      auVar16._8_8_ = 0;
      auVar16._0_4_ = TVar3.x;
      auVar16._4_4_ = TVar3.y;
      uVar6 = uVar7 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
      auVar10 = vpshufd_avx(auVar10 ^ auVar12,0xe8);
      auVar13 = vprorvd_avx512vl(auVar10,auVar13);
      auVar13 = vcvtudq2ps_avx512vl(auVar13);
      auVar14._0_4_ = auVar13._0_4_ * 2.3283064e-10;
      auVar14._4_4_ = auVar13._4_4_ * 2.3283064e-10;
      auVar14._8_4_ = auVar13._8_4_ * 2.3283064e-10;
      auVar14._12_4_ = auVar13._12_4_ * 2.3283064e-10;
      auVar13 = vminps_avx(auVar14,auVar18._0_16_);
      auVar10._0_4_ = (auVar13._0_4_ + auVar9._0_4_) * 0.015625;
      auVar10._4_4_ = (auVar13._4_4_ + auVar9._4_4_) * 0.015625;
      auVar10._8_4_ = (auVar13._8_4_ + auVar9._8_4_) * 0.015625;
      auVar10._12_4_ = (auVar13._12_4_ + auVar9._12_4_) * 0.015625;
      auVar9 = vsubps_avx(auVar20._0_16_,auVar10);
      auVar13._0_4_ = auVar10._0_4_ * TVar3.x;
      auVar13._4_4_ = auVar10._4_4_ * TVar3.y;
      auVar13._8_4_ = auVar10._8_4_ * 0.0;
      auVar13._12_4_ = auVar10._12_4_ * 0.0;
      auVar9 = vfnmadd231ps_fma(auVar13,auVar16,auVar9);
      local_50 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar9);
      FVar8 = Evaluate(this,(Point2f *)&local_50);
      auVar20 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
      auVar18 = ZEXT1664(CONCAT412(0x3f7fffff,CONCAT48(0x3f7fffff,0x3f7fffff3f7fffff)));
      auVar9 = vpmovsxbq_avx(ZEXT216(0x1b2d));
      auVar19 = ZEXT1664(auVar9);
      auVar9 = vpmovsxbq_avx(ZEXT216(0x2d1b));
      auVar17 = ZEXT1664(auVar9);
      iVar5 = iVar5 + 1;
      fVar11 = fVar11 + FVar8;
    } while (iVar5 != 0x40);
    iVar4 = iVar4 + 1;
  } while (iVar4 != 0x40);
  fVar1 = fVar1 + fVar1;
  return (fVar1 + fVar1) * fVar2 * fVar11 * 0.00024414062;
}

Assistant:

Float LanczosSincFilter::Integral() const {
    Float sum = 0;
    int sqrtSamples = 64;
    int nSamples = sqrtSamples * sqrtSamples;
    Float area = 2 * radius.x * 2 * radius.y;
    RNG rng;
    for (int y = 0; y < sqrtSamples; ++y) {
        for (int x = 0; x < sqrtSamples; ++x) {
            Point2f u((x + rng.Uniform<Float>()) / sqrtSamples,
                      (y + rng.Uniform<Float>()) / sqrtSamples);
            Point2f p(Lerp(u.x, -radius.x, radius.x), Lerp(u.y, -radius.y, radius.y));
            sum += Evaluate(p);
        }
    }
    return sum / nSamples * area;
}